

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall
happly::TypedListProperty<float>::readNext(TypedListProperty<float> *this,istream *stream)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference pvVar1;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  size_t afterSize;
  size_t currSize;
  size_t count;
  unsigned_long *__args;
  size_type __new_size;
  
  __new_size = 0;
  std::istream::read((char *)in_RSI,(long)&stack0xffffffffffffffe8);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            geometrycentral::surface::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x28));
  __args = (unsigned_long *)
           ((long)&(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + __new_size);
  geometrycentral::surface::std::vector<float,_std::allocator<float>_>::resize(in_RSI,__new_size);
  if (__new_size != 0) {
    pvVar1 = geometrycentral::surface::std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x28),(size_type)this_00)
    ;
    std::istream::read((char *)in_RSI,(long)pvVar1);
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            (this_00,__args);
  return;
}

Assistant:

virtual void readNext(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);
  }